

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# dtfmtsym.cpp
# Opt level: O0

void __thiscall
icu_63::DateFormatSymbols::DateFormatSymbols(DateFormatSymbols *this,DateFormatSymbols *other)

{
  DateFormatSymbols *other_local;
  DateFormatSymbols *this_local;
  
  UObject::UObject(&this->super_UObject,&other->super_UObject);
  (this->super_UObject)._vptr_UObject = (_func_int **)&PTR__DateFormatSymbols_005bd308;
  icu_63::UnicodeString::UnicodeString(&this->fTimeSeparator);
  Locale::Locale(&this->fZSFLocale);
  icu_63::UnicodeString::UnicodeString(&this->fLocalPatternChars);
  copyData(this,other);
  return;
}

Assistant:

DateFormatSymbols::DateFormatSymbols(const DateFormatSymbols& other)
    : UObject(other)
{
    copyData(other);
}